

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O0

Iterator __thiscall Kernel::Inference::iterator(Inference *this)

{
  Inference *this_local;
  Iterator it;
  
  if ((*(byte *)this & 3) == 0) {
    it.field_0 = (anon_union_8_2_756040a0_for_Iterator_0)((ulong)it.field_0 & 0xffffffff00000000);
  }
  else if ((byte)((*(byte *)this & 3) - 1) < 2) {
    it.field_0 = (anon_union_8_2_756040a0_for_Iterator_0)this->_ptr1;
  }
  return (Iterator)it.field_0.pointer;
}

Assistant:

Inference::Iterator Inference::iterator() const
{
  Iterator it;
  switch(_kind) {
    case Kind::INFERENCE_012:
      it.integer=0;
      break;
    case Kind::INFERENCE_MANY:
    case Kind::INFERENCE_FROM_SAT_REFUTATION:
      it.pointer = _ptr1;
      break;
  }

  return it;
}